

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm_vecsmall::SmallVectorImpl<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>_>
::~SmallVectorImpl(SmallVectorImpl<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>_>
                   *this)

{
  bool bVar1;
  iterator pvVar2;
  iterator E;
  SmallVectorImpl<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>_> *this_local;
  
  pvVar2 = SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
           ::begin((SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
                    *)this);
  E = SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
      ::end((SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
             *)this);
  SmallVectorTemplateBase<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_false>
  ::destroy_range(pvVar2,E);
  bVar1 = SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
          ::isSmall((SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
                     *)this);
  if (!bVar1) {
    pvVar2 = SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
             ::begin((SmallVectorTemplateCommon<eggs::variants::variant<SyntaxTree_*,_std::experimental::nullopt_t>,_void>
                      *)this);
    free(pvVar2);
  }
  return;
}

Assistant:

~SmallVectorImpl() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());

    // If this wasn't grown from the inline copy, deallocate the old space.
    if (!this->isSmall())
      free(this->begin());
  }